

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O1

void __thiscall BayesianGameBase::Initialize(BayesianGameBase *this)

{
  array_type *this_00;
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  _Base_ptr p_Var4;
  size_t *psVar5;
  ulong uVar6;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_01;
  long lVar7;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *pmVar8;
  const_iterator __first;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  bad_alloc anon_var_0;
  allocator_type local_41;
  vector<double,_std::allocator<double>_> local_40;
  value_type_conflict3 local_28;
  
  if (this->_m_stepSizeTypes != (size_t *)0x0) {
    operator_delete__(this->_m_stepSizeTypes);
  }
  if (this->_m_stepSizeActions != (size_t *)0x0) {
    operator_delete__(this->_m_stepSizeActions);
  }
  psVar5 = IndexTools::CalculateStepSize(&this->_m_nrTypes);
  this->_m_stepSizeTypes = psVar5;
  psVar5 = IndexTools::CalculateStepSize(&this->_m_nrActions);
  this->_m_stepSizeActions = psVar5;
  uVar6 = 1;
  this->_m_nrJTypes = 1;
  this->_m_nrJA = 1;
  if (this->_m_nrAgents != 0) {
    puVar2 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar9 = this->_m_nrJTypes;
    sVar11 = this->_m_nrJA;
    do {
      uVar10 = puVar3[uVar6 - 1] * sVar9;
      this->_m_nrJTypes = uVar10;
      if (uVar10 < sVar9) {
        this->_m_JToverflow = true;
      }
      uVar12 = puVar2[uVar6 - 1] * sVar11;
      this->_m_nrJA = uVar12;
      if (uVar12 < sVar11) {
        this->_m_JAoverflow = true;
      }
      uVar13 = uVar6 & 0xffffffff;
      uVar6 = uVar6 + 1;
      sVar9 = uVar10;
      sVar11 = uVar12;
    } while (uVar13 < this->_m_nrAgents);
  }
  if ((this->_m_nrJTypes < 0x186a1) && (this->_m_JToverflow != true)) {
    this->_m_useSparse = false;
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_40,this->_m_nrJTypes,&local_28,&local_41);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->_m_jTypeProbs,&local_40);
    if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    this_01 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)operator_new(0x18);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(this_01,this->_m_nrJTypes,(allocator_type *)&local_40);
    this->_m_jointToIndTypes = this_01;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BayesianGameBase: using sparse models",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    this->_m_useSparse = true;
  }
  lVar7 = 0x68;
  if (this->_m_useSparse == true) {
    p_Var4 = *(_Base_ptr *)
              ((long)&(this->_m_jTypeProbsSparse).data_.
                      super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    uVar6 = this->_m_nrJTypes;
    (this->_m_jTypeProbsSparse).size_ = uVar6;
    this_00 = &(this->_m_jTypeProbsSparse).data_;
    p_Var1 = &(this->_m_jTypeProbsSparse).data_.
              super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    __first._M_node = &p_Var1->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar6]) {
      if (*(ulong *)(p_Var4 + 1) >= uVar6) {
        __first._M_node = p_Var4;
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                    *)this_00,__first,(const_iterator)p_Var1);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             *)this_00);
    pmVar8 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)operator_new(0x30);
    p_Var1 = &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(pmVar8->_M_t)._M_impl = 0;
    *(undefined8 *)&(pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->_m_jointToIndTypesMap = pmVar8;
    lVar7 = 0x60;
  }
  *(undefined8 *)
   ((long)&(this->super_Interface_ProblemToPolicyDiscretePure).
           super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete + lVar7)
       = 0;
  Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies
            (&this->super_Interface_ProblemToPolicyDiscretePure,TYPE_INDEX,999999);
  if (this->_m_JToverflow == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "BayesianGameBase::Initialize: Warning, joint types are overflowing",0x42);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  if (this->_m_JAoverflow == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "BayesianGameBase::Initialize: Warning, joint actions are overflowing",0x44);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  this->_m_initialized = true;
  return;
}

Assistant:

void BayesianGameBase::Initialize()
{
    if(_m_stepSizeTypes)
        delete[] _m_stepSizeTypes;
    if(_m_stepSizeActions)
        delete[] _m_stepSizeActions;
    _m_stepSizeTypes = IndexTools::CalculateStepSize(_m_nrTypes);
    _m_stepSizeActions = IndexTools::CalculateStepSize(_m_nrActions);

    //calculate # joint types and actions
    _m_nrJTypes = 1;
    _m_nrJA = 1;
    for(Index i = 0; i < _m_nrAgents; i++)
    {
        size_t old_JT = _m_nrJTypes;
        _m_nrJTypes *= _m_nrTypes[i];
        if (old_JT > _m_nrJTypes)
            _m_JToverflow = true;
            //throw EOverflow("BayesianGameBase::Number of joint types are overflowing");

        size_t old_JA = _m_nrJA;
        _m_nrJA *= _m_nrActions[i];
        if (old_JA > _m_nrJA)
            _m_JAoverflow = true;
            //throw EOverflow("BayesianGameBase::Number of joint actions are overflowing");
    }

    if(_m_nrJTypes>1e5 || _m_JToverflow)
    {
        cout << "BayesianGameBase: using sparse models" << endl;
        _m_useSparse=true;
    }
    else
    {
        _m_useSparse=false;
        try {
            _m_jTypeProbs = vector<double>(_m_nrJTypes, 0.0);
            _m_jointToIndTypes = new vector<vector<Index> >(_m_nrJTypes);
        } catch(std::bad_alloc)
        {
            cout << "BayesianGameBase: too many joint types ("
                 << _m_nrJTypes
                 << ") to have a full vector in memory, switching to sparse models..." << endl;
            _m_useSparse=true;
        }
    }

    //initialize the probability distribution over joint types:
    if(_m_useSparse)
    {
        _m_jTypeProbsSparse.resize(_m_nrJTypes);
        _m_jTypeProbsSparse.clear();
        _m_jointToIndTypesMap = new map<Index, vector<Index> >();
        _m_jointToIndTypes=0;
    }
    else
    {
        _m_jointToIndTypesMap=0;
    }


    // call this as it checks whether the joint policy indices will be
    // overflowing, resulting in an exception
    try {
        GetNrJointPolicies();
    }
    catch(EOverflow& e){ 
        cout << "BayesianGameBase::Initialize: Warning, joint policy indices are overflowing (don't rely on enumaration of all joint policies!)" << endl;
    }
    if(_m_JToverflow)
        cout << "BayesianGameBase::Initialize: Warning, joint types are overflowing" << endl;
    if(_m_JAoverflow)
        cout << "BayesianGameBase::Initialize: Warning, joint actions are overflowing" << endl;

    _m_initialized=true;
}